

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

bool __thiscall VmBlock::HasExternalInstructionUsers(VmBlock *this)

{
  VmInstruction *pVVar1;
  VmValue *pVVar2;
  VmValue **ppVVar3;
  uint i;
  uint index;
  VmInstruction **ppVVar4;
  
  ppVVar4 = &this->firstInstruction;
  while (pVVar1 = *ppVVar4, pVVar1 != (VmInstruction *)0x0) {
    for (index = 0; index < (pVVar1->super_VmValue).users.count; index = index + 1) {
      ppVVar3 = SmallArray<VmValue_*,_8U>::operator[](&(pVVar1->super_VmValue).users,index);
      pVVar2 = *ppVVar3;
      if (((pVVar2 != (VmValue *)0x0) && (pVVar2->typeID == 2)) &&
         ((VmBlock *)pVVar2[1].users.data != this)) goto LAB_0024a7bf;
    }
    ppVVar4 = &pVVar1->nextSibling;
  }
LAB_0024a7bf:
  return pVVar1 != (VmInstruction *)0x0;
}

Assistant:

bool VmBlock::HasExternalInstructionUsers()
{
	for(VmInstruction *curr = firstInstruction; curr; curr = curr->nextSibling)
	{
		for(unsigned i = 0; i < curr->users.size(); i++)
		{
			if(VmInstruction *instUser = getType<VmInstruction>(curr->users[i]))
			{
				if(instUser->parent != this)
					return true;
			}
		}
	}

	return false;
}